

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QJsonValue * __thiscall QCborValue::toJsonValue(QJsonValue *__return_storage_ptr__,QCborValue *this)

{
  Type t;
  long idx;
  bool b;
  Type type;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QCborContainerPrivate **)(this + 8) != (QCborContainerPrivate *)0x0) {
    idx = -(long)*(int *)(this + 0x10);
    if (-1 < *(long *)this) {
      idx = *(long *)this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      qt_convertToJson(__return_storage_ptr__,*(QCborContainerPrivate **)(this + 8),idx,FromRaw);
      return __return_storage_ptr__;
    }
    goto LAB_002c0280;
  }
  t = *(Type *)(this + 0x10);
  if (((uint)(t + 0xffff0000) < 0x26) &&
     ((0x2900000001U >> ((ulong)(uint)(t + 0xffff0000) & 0x3f) & 1) != 0)) {
LAB_002c00ea:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      type = Undefined;
LAB_002c013d:
      QJsonValue::QJsonValue(__return_storage_ptr__,type);
      return __return_storage_ptr__;
    }
  }
  else {
    if (((uint)(t + ~True) < 2) || (t == Invalid)) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002c0280;
      type = Null;
      goto LAB_002c013d;
    }
    if (t == Integer) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,(QCborValue *)this);
        return __return_storage_ptr__;
      }
      goto LAB_002c0280;
    }
    if ((t == ByteArray) || (t == String)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        type = String;
        goto LAB_002c013d;
      }
      goto LAB_002c0280;
    }
    if (t == Array) {
      QJsonArray::QJsonArray((QJsonArray *)&local_30);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30);
      QJsonArray::~QJsonArray((QJsonArray *)&local_30);
    }
    else if (t == Map) {
      QJsonObject::QJsonObject((QJsonObject *)&local_30);
      QJsonValue::QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_30);
      QJsonObject::~QJsonObject((QJsonObject *)&local_30);
    }
    else {
      if (t == Tag) goto LAB_002c00ea;
      if (t == Double) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          fpToJson(__return_storage_ptr__,*(double *)this);
          return __return_storage_ptr__;
        }
        goto LAB_002c0280;
      }
      if (t == True) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          b = true;
LAB_002c0186:
          QJsonValue::QJsonValue(__return_storage_ptr__,b);
          return __return_storage_ptr__;
        }
        goto LAB_002c0280;
      }
      if (t == False) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          b = false;
          goto LAB_002c0186;
        }
        goto LAB_002c0280;
      }
      simpleTypeString((QString *)&QStack_48,t);
      QCborValue((QCborValue *)&local_30,(QString *)&QStack_48);
      QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,&local_30);
      ~QCborValue((QCborValue *)&local_30);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
LAB_002c0280:
  __stack_chk_fail();
}

Assistant:

QJsonValue QCborValue::toJsonValue() const
{
    if (container)
        return qt_convertToJson(container, n < 0 ? -type() : n);

    // simple values
    switch (type()) {
    case False:
        return false;

    case Integer:
        return QJsonPrivate::Value::fromTrustedCbor(*this);

    case True:
        return true;

    case Null:
    case Undefined:
    case Invalid:
        return QJsonValue();

    case Double:
        return fpToJson(fp_helper());

    case SimpleType:
        break;

    case ByteArray:
    case String:
        // empty strings
        return QJsonValue::String;

    case Array:
        // empty array
        return QJsonArray();

    case Map:
        // empty map
        return QJsonObject();

    case Tag:
    case DateTime:
    case Url:
    case RegularExpression:
    case Uuid:
        // Reachable, but invalid in Json
        return QJsonValue::Undefined;
    }

    return QJsonPrivate::Value::fromTrustedCbor(simpleTypeString(type()));
}